

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeArrayBufferConstructor
               (DynamicObject *arrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction *pRVar1;
  PropertyString *pPVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayBufferConstructor,mode,4,0);
  this = (((arrayBufferConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0x124,
             (((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             arrayBufferPrototype.ptr,0,0,0,0);
  pRVar1 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)ArrayBuffer::EntryInfo::GetterSymbolSpecies);
  if (pRVar1 == (RuntimeFunction *)0x0) {
    pRVar1 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (arrayBufferConstructor,0x19,pRVar1);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(arrayBufferConstructor,0x19,6);
  pPVar2 = ScriptContext::GetPropertyString(this_00,0x1ac);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0x106,pPVar2,2,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)ArrayBuffer::EntryInfo::IsView,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,200);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,200,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)ArrayBuffer::EntryInfo::Detach,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x73);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0x73,pRVar1,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(arrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayBufferConstructor(DynamicObject* arrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = arrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayBufferConstructor->GetLibrary();
        library->AddMember(arrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayBufferConstructor, &ArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::ArrayBuffer), PropertyConfigurable);

        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::isView, &ArrayBuffer::EntryInfo::IsView, 1);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::detach, &ArrayBuffer::EntryInfo::Detach, 1);
#endif
        arrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }